

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::
BinaryExpr<const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&,_const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&>
::streamReconstructedExpression
          (BinaryExpr<const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&,_const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&>
           *this,ostream *os)

{
  lagfib2plus<unsigned_int,_168U,_521U> *in_RSI;
  string *in_RDI;
  string *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  StringRef in_stack_ffffffffffffff98;
  string local_30 [48];
  
  Detail::stringify<trng::lagfib2plus<unsigned_int,168u,521u>>(in_RSI);
  Detail::stringify<trng::lagfib2plus<unsigned_int,168u,521u>>(in_RSI);
  formatReconstructedExpression
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff98,in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }